

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blt_mpi_smoke.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *this;
  long *plVar1;
  int globalValue;
  int commSize;
  int valueToSend;
  int commRank;
  int local_34;
  int local_30;
  undefined4 local_2c;
  int local_28;
  undefined1 local_24 [4];
  undefined1 local_20 [8];
  
  MPI_Init(local_24,local_20);
  local_28 = -1;
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_28);
  local_30 = -1;
  MPI_Comm_size(&ompi_mpi_comm_world);
  local_34 = 0;
  local_2c = 1;
  MPI_Reduce(&local_2c,&local_34,1,&ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Finalize();
  if (local_28 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Count should be equal to rank size",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Count = ",8);
    this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_34);
    std::__ostream_insert<char,std::char_traits<char>>(this,", Size = ",9);
    plVar1 = (long *)std::ostream::operator<<(this,local_30);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    if (local_34 != local_30) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  // Initialize MPI and get rank and comm size
  MPI_Init(&argc, &argv);

  int commRank = -1;
  MPI_Comm_rank(MPI_COMM_WORLD, &commRank);
  int commSize = -1;
  MPI_Comm_size(MPI_COMM_WORLD, &commSize);

  // Do a basic mpi reduce to determine this actually works
  int globalValue = 0;
  int valueToSend = 1;
  MPI_Reduce(&valueToSend, &globalValue, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);

  // Finalize MPI
  MPI_Finalize();

  if (commRank == 0)
  {
    std::cout << "Count should be equal to rank size" << std::endl;
    std::cout << "Count = " << globalValue << ", Size = " << commSize << std::endl;

    if (globalValue != commSize)
    {
      return 1;
    }
  }

  return 0;
}